

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

void headerJSON(FILE *stream,per_transfer *per)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *name;
  size_t i;
  size_t a;
  curl_header *prev;
  curl_header *header;
  per_transfer *per_local;
  FILE *stream_local;
  
  a = 0;
  header = (curl_header *)per;
  per_local = (per_transfer *)stream;
  fputc(0x7b,(FILE *)stream);
  do {
    do {
      while( true ) {
        prev = (curl_header *)curl_easy_nextheader(*(undefined8 *)&header->origin,1,0xffffffff,a);
        if (prev == (curl_header *)0x0) {
          fputs("\n}",(FILE *)per_local);
          return;
        }
        if (1 < prev->amount) break;
        if (a != 0) {
          fputs(",\n",(FILE *)per_local);
        }
        jsonWriteString((FILE *)per_local,prev->name,true);
        fputc(0x3a,(FILE *)per_local);
        fputc(0x5b,(FILE *)per_local);
        jsonWriteString((FILE *)per_local,prev->value,false);
        fputc(0x5d,(FILE *)per_local);
        a = (size_t)prev;
      }
    } while (prev->index != 0);
    pcVar1 = (char *)prev->amount;
    name = (char *)0x0;
    pcVar2 = prev->name;
    if (a != 0) {
      fputs(",\n",(FILE *)per_local);
    }
    jsonWriteString((FILE *)per_local,prev->name,true);
    fputc(0x3a,(FILE *)per_local);
    a = (size_t)prev;
    fputc(0x5b,(FILE *)per_local);
    do {
      jsonWriteString((FILE *)per_local,prev->value,false);
      name = name + 1;
      if (pcVar1 <= name) break;
      fputc(0x2c,(FILE *)per_local);
      iVar3 = curl_easy_header(*(undefined8 *)&header->origin,pcVar2,name,1,0xffffffff,&prev);
    } while (iVar3 == 0);
    fputc(0x5d,(FILE *)per_local);
  } while( true );
}

Assistant:

void headerJSON(FILE *stream, struct per_transfer *per)
{
  struct curl_header *header;
  struct curl_header *prev = NULL;

  fputc('{', stream);
  while((header = curl_easy_nextheader(per->curl, CURLH_HEADER, -1,
                                       prev)) != NULL) {
    if(header->amount > 1) {
      if(!header->index) {
        /* act on the 0-index entry and pull the others in, then output in a
           JSON list */
        size_t a = header->amount;
        size_t i = 0;
        char *name = header->name;
        if(prev)
          fputs(",\n", stream);
        jsonWriteString(stream, header->name, TRUE);
        fputc(':', stream);
        prev = header;
        fputc('[', stream);
        do {
          jsonWriteString(stream, header->value, FALSE);
          if(++i >= a)
            break;
          fputc(',', stream);
          if(curl_easy_header(per->curl, name, i, CURLH_HEADER,
                              -1, &header))
            break;
        } while(1);
        fputc(']', stream);
      }
    }
    else {
      if(prev)
        fputs(",\n", stream);
      jsonWriteString(stream, header->name, TRUE);
      fputc(':', stream);
      fputc('[', stream);
      jsonWriteString(stream, header->value, FALSE);
      fputc(']', stream);
      prev = header;
    }
  }
  fputs("\n}", stream);
}